

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall
spoa::Graph::Edge::Edge(Edge *this,Node *tail,Node *head,uint32_t label,uint32_t weight)

{
  allocator<unsigned_int> local_29;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t weight_local;
  uint32_t label_local;
  Node *head_local;
  Node *tail_local;
  Edge *this_local;
  
  this->tail = tail;
  this->head = head;
  local_28 = weight;
  local_24 = label;
  _weight_local = head;
  head_local = tail;
  tail_local = (Node *)this;
  std::allocator<unsigned_int>::allocator(&local_29);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->labels,1,&local_24,&local_29);
  std::allocator<unsigned_int>::~allocator(&local_29);
  this->weight = (ulong)local_28;
  return;
}

Assistant:

Graph::Edge::Edge(
    Node* tail,
    Node* head,
    std::uint32_t label,
    std::uint32_t weight)
    : tail(tail),
      head(head),
      labels(1, label),
      weight(weight) {
}